

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

bool comparesEqual(QDir *lhs,QDir *rhs)

{
  QDirPrivate *this;
  QDirPrivate *this_00;
  QAbstractFileEngine *pQVar1;
  compare_eq_result_container<QList<QString>,_QString> cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  CaseSensitivity CVar7;
  long in_FS_OFFSET;
  QStringView rhs_00;
  QStringView lhs_00;
  QString local_78;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = (lhs->d_ptr).d.ptr;
  this_00 = (rhs->d_ptr).d.ptr;
  bVar4 = true;
  if (this == this_00) goto LAB_00228bfd;
  pQVar1 = (this->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  if ((pQVar1 == (QAbstractFileEngine *)0x0) ||
     ((this_00->fileEngine)._M_t.
      super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
      super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
      super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl == (QAbstractFileEngine *)0x0
     )) {
    if (pQVar1 == (this_00->fileEngine)._M_t.
                  super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                  .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl) {
      local_58._0_8_ = &this->fileCache;
      if (this == this_00) {
        local_58._8_8_ = (FileCache *)0x0;
      }
      else {
        local_58._8_8_ = &this_00->fileCache;
        if (this_00 <= this) {
          local_58._8_8_ = local_58._0_8_;
          local_58._0_8_ = &this_00->fileCache;
        }
      }
      local_48 = (undefined1 *)0xaaaaaaaaaaaaaa00;
      QOrderedMutexLocker::relock((QOrderedMutexLocker *)local_58);
      bVar4 = QFileSystemEngine::isCaseSensitive(&this->dirEntry,&(this->fileCache).metaData);
      bVar3 = QFileSystemEngine::isCaseSensitive(&this_00->dirEntry,&(this_00->fileCache).metaData);
      QOrderedMutexLocker::unlock((QOrderedMutexLocker *)local_58);
      CVar7 = (CaseSensitivity)bVar4;
      if (bVar3 == bVar4) goto LAB_00228afd;
    }
  }
  else {
    iVar5 = (*pQVar1->_vptr_QAbstractFileEngine[0x12])();
    iVar6 = (*((this_00->fileEngine)._M_t.
               super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
               ._M_t.
               super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
               .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl)->
              _vptr_QAbstractFileEngine[0x12])();
    if ((char)iVar5 == (char)iVar6) {
      CVar7 = (*((this->fileEngine)._M_t.
                 super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                 .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl)->
                _vptr_QAbstractFileEngine[0x12])();
      CVar7 = CVar7 & 0xff;
LAB_00228afd:
      bVar4 = true;
      if ((((this->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
            super_QFlagsStorage<QDir::Filter>.i ==
            (this_00->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
            super_QFlagsStorage<QDir::Filter>.i) &&
          ((this->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
           super_QFlagsStorage<QDir::SortFlag>.i ==
           (this_00->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
           super_QFlagsStorage<QDir::SortFlag>.i)) &&
         (cVar2 = QList<QString>::operator==(&this->nameFilters,&this_00->nameFilters), cVar2)) {
        QFileSystemEntry::filePath((QString *)local_58,&this->dirEntry);
        QFileSystemEntry::filePath(&local_78,&this_00->dirEntry);
        if (local_48 == (undefined1 *)local_78.d.size) {
          rhs_00.m_data = local_78.d.ptr;
          rhs_00.m_size = local_78.d.size;
          lhs_00.m_data = (storage_type_conflict *)local_58._8_8_;
          lhs_00.m_size = (qsizetype)local_48;
          bVar3 = QtPrivate::equalStrings(lhs_00,rhs_00);
        }
        else {
          bVar3 = false;
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
          }
        }
        if (bVar3 != false) goto LAB_00228bfd;
        bVar4 = QDirPrivate::exists((lhs->d_ptr).d.ptr);
        bVar3 = QDirPrivate::exists((rhs->d_ptr).d.ptr);
        if (bVar4) {
          if (bVar3) {
            QDir::canonicalPath((QString *)local_58,lhs);
            QDir::canonicalPath(&local_78,rhs);
LAB_00228c62:
            iVar5 = QString::compare((QString *)local_58,&local_78,CVar7);
            bVar4 = iVar5 == 0;
            if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
              }
            }
            goto LAB_00228bfd;
          }
        }
        else if (!bVar3) {
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QDirPrivate::resolveAbsoluteEntry((QString *)local_58,this);
          local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QDirPrivate::resolveAbsoluteEntry(&local_78,this_00);
          goto LAB_00228c62;
        }
      }
    }
  }
  bVar4 = false;
LAB_00228bfd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool comparesEqual(const QDir &lhs, const QDir &rhs)
{
    const QDirPrivate *d = lhs.d_ptr.constData();
    const QDirPrivate *other = rhs.d_ptr.constData();

    if (d == other)
        return true;
    Qt::CaseSensitivity sensitive;
    if (!d->fileEngine || !other->fileEngine) {
        if (d->fileEngine.get() != other->fileEngine.get()) // one is native, the other is a custom file-engine
            return false;

        QOrderedMutexLocker locker(&d->fileCache.mutex, &other->fileCache.mutex);
        const bool thisCaseSensitive = QFileSystemEngine::isCaseSensitive(d->dirEntry, d->fileCache.metaData);
        if (thisCaseSensitive != QFileSystemEngine::isCaseSensitive(other->dirEntry, other->fileCache.metaData))
            return false;

        sensitive = thisCaseSensitive ? Qt::CaseSensitive : Qt::CaseInsensitive;
    } else {
        if (d->fileEngine->caseSensitive() != other->fileEngine->caseSensitive())
            return false;
        sensitive = d->fileEngine->caseSensitive() ? Qt::CaseSensitive : Qt::CaseInsensitive;
    }

    if (d->filters == other->filters
       && d->sort == other->sort
       && d->nameFilters == other->nameFilters) {

        // Assume directories are the same if path is the same
        if (d->dirEntry.filePath() == other->dirEntry.filePath())
            return true;

        if (lhs.exists()) {
            if (!rhs.exists())
                return false; //can't be equal if only one exists
            // Both exist, fallback to expensive canonical path computation
            return lhs.canonicalPath().compare(rhs.canonicalPath(), sensitive) == 0;
        } else {
            if (rhs.exists())
                return false; //can't be equal if only one exists
            // Neither exists, compare absolute paths rather than canonical (which would be empty strings)
            QString thisFilePath = d->resolveAbsoluteEntry();
            QString otherFilePath = other->resolveAbsoluteEntry();
            return thisFilePath.compare(otherFilePath, sensitive) == 0;
        }
    }
    return false;
}